

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O2

void Function_Pool::ProjectionProfile
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,bool horizontal,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *projection)

{
  FunctionTask local_170;
  
  FunctionTask::FunctionTask(&local_170);
  FunctionTask::ProjectionProfile(&local_170,image,x,y,width,height,horizontal,projection);
  FunctionTask::~FunctionTask(&local_170);
  return;
}

Assistant:

void ProjectionProfile( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, bool horizontal,
                            std::vector < uint32_t > & projection )
    {
        FunctionTask().ProjectionProfile( image, x, y, width, height, horizontal, projection );
    }